

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.h
# Opt level: O1

person * __thiscall
rest_rpc::rpc_service::msgpack_codec::unpack<person>
          (person *__return_storage_ptr__,msgpack_codec *this,char *data,size_t length)

{
  bool referenced;
  object v;
  unpack_limit local_50;
  
  local_50.array_ = 0xffffffff;
  local_50.map_ = 0xffffffff;
  local_50.str_ = 0xffffffff;
  local_50.bin_ = 0xffffffff;
  local_50.ext_ = 0xffffffff;
  local_50.depth_ = 0xffffffff;
  v.super_object.type = NIL;
  v.super_object._4_4_ = 0;
  msgpack::v3::unpack(&this->msg_,data,length,(size_t *)&v,&referenced,(unpack_reference_func)0x0,
                      (void *)0x0,&local_50);
  local_50.map_ = (size_t)&__return_storage_ptr__->name;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  v.super_object.via.array.ptr = (this->msg_).m_obj.super_object.via.array.ptr;
  v.super_object.type = (this->msg_).m_obj.super_object.type;
  v.super_object._4_4_ = *(undefined4 *)&(this->msg_).m_obj.super_object.field_0x4;
  v.super_object.via.u64 = (this->msg_).m_obj.super_object.via.u64;
  local_50.array_ = (size_t)&__return_storage_ptr__->age;
  local_50.str_ = (size_t)__return_storage_ptr__;
  msgpack::v1::type::
  define_array<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  ::msgpack_unpack((define_array<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                    *)&local_50,&v);
  return __return_storage_ptr__;
}

Assistant:

T unpack(char const *data, size_t length) {
    try {
      msgpack::unpack(msg_, data, length);
      return msg_.get().as<T>();
    } catch (...) {
      throw std::invalid_argument("unpack failed: Args not match!");
    }
  }